

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * escapestring(char *s)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  vector<char> *local_38;
  char local_29;
  vector<char> *local_28;
  vector<char> *buf;
  char *local_10;
  char *s_local;
  
  local_10 = s;
  if (escapestring(char_const*)::strbuf == '\0') {
    iVar2 = __cxa_guard_acquire(&escapestring(char_const*)::strbuf);
    if (iVar2 != 0) {
      local_38 = escapestring::strbuf;
      do {
        vector<char>::vector(local_38);
        local_38 = local_38 + 1;
      } while (local_38 != (vector<char> *)&escapestring(char_const*)::strbuf);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&escapestring(char_const*)::strbuf);
    }
  }
  escapestring::stridx = (escapestring::stridx + 1) % 3;
  local_28 = escapestring::strbuf + escapestring::stridx;
  vector<char>::setsize(local_28,0);
  local_29 = '\"';
  vector<char>::add(local_28,&local_29);
  for (; *local_10 != '\0'; local_10 = local_10 + 1) {
    cVar1 = *local_10;
    if (cVar1 == '\t') {
      vector<char>::put(local_28,"^t",2);
    }
    else if (cVar1 == '\n') {
      vector<char>::put(local_28,"^n",2);
    }
    else if (cVar1 == '\f') {
      vector<char>::put(local_28,"^f",2);
    }
    else if (cVar1 == '\"') {
      vector<char>::put(local_28,"^\"",2);
    }
    else if (cVar1 == '^') {
      vector<char>::put(local_28,"^^",2);
    }
    else {
      vector<char>::add(local_28,local_10);
    }
  }
  vector<char>::put(local_28,"\"",2);
  pcVar3 = vector<char>::getbuf(local_28);
  return pcVar3;
}

Assistant:

const char *escapestring(const char *s)
{
    static vector<char> strbuf[3];
    static int stridx = 0;
    stridx = (stridx + 1)%3;
    vector<char> &buf = strbuf[stridx];
    buf.setsize(0);
    buf.add('"');
    for(; *s; s++) switch(*s)
    {
        case '\n': buf.put("^n", 2); break;
        case '\t': buf.put("^t", 2); break;
        case '\f': buf.put("^f", 2); break;
        case '"': buf.put("^\"", 2); break;
        case '^': buf.put("^^", 2); break;
        default: buf.add(*s); break;
    }
    buf.put("\"\0", 2);
    return buf.getbuf();
}